

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  sqlite3_vtab *zIn;
  size_t sVar1;
  sqlite3_vtab *local_150;
  char *zRoot;
  JsonString x_1;
  JsonString x;
  JsonNode *pJStack_30;
  u32 iKey;
  JsonNode *pThis;
  JsonEachCursor *p;
  int i_local;
  sqlite3_context *ctx_local;
  sqlite3_vtab_cursor *cur_local;
  
  pJStack_30 = (JsonNode *)(&(cur[7].pVtab)->pModule + (ulong)*(uint *)&cur[2].pVtab * 2);
  switch(i) {
  case 0:
    if (*(int *)&cur[2].pVtab != 0) {
      if (*(char *)&cur[3].pVtab == '\a') {
        jsonReturn(pJStack_30,ctx,(sqlite3_value **)0x0);
      }
      else if (*(char *)&cur[3].pVtab == '\x06') {
        if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
          x._132_4_ = *(undefined4 *)&cur[1].pVtab;
        }
        else {
          if (*(int *)&cur[1].pVtab == 0) {
            return 0;
          }
          x._132_4_ = (&(cur[7].pVtab)->nRef)
                      [(ulong)*(uint *)((long)&(cur[9].pVtab)->pModule +
                                       (ulong)*(uint *)&cur[2].pVtab * 4) * 4];
        }
        sqlite3_result_int64(ctx,(ulong)(uint)x._132_4_);
      }
    }
    break;
  case 1:
    if ((pJStack_30->jnFlags & 0x40) != 0) {
      pJStack_30 = pJStack_30 + 1;
    }
    jsonReturn(pJStack_30,ctx,(sqlite3_value **)0x0);
    break;
  case 2:
    if ((pJStack_30->jnFlags & 0x40) != 0) {
      pJStack_30 = pJStack_30 + 1;
    }
    sqlite3_result_text(ctx,jsonType[pJStack_30->eType],-1,(_func_void_void_ptr *)0x0);
    break;
  case 3:
    if ((pJStack_30->jnFlags & 0x40) != 0) {
      pJStack_30 = pJStack_30 + 1;
    }
    if (pJStack_30->eType < 6) {
      jsonReturn(pJStack_30,ctx,(sqlite3_value **)0x0);
    }
    break;
  case 4:
    sqlite3_result_int64
              (ctx,(ulong)*(uint *)&cur[2].pVtab +
                   (long)(int)(uint)((pJStack_30->jnFlags & 0x40) != 0));
    break;
  case 5:
    if ((*(uint *)((long)&cur[1].pVtab + 4) < *(uint *)&cur[2].pVtab) &&
       (*(char *)((long)&cur[3].pVtab + 1) != '\0')) {
      sqlite3_result_int64
                (ctx,(ulong)*(uint *)((long)&(cur[9].pVtab)->pModule +
                                     (ulong)*(uint *)&cur[2].pVtab * 4));
    }
    break;
  case 6:
    jsonInit((JsonString *)(x_1.zSpace + 0x5e),ctx);
    if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
      if (cur[5].pVtab == (sqlite3_vtab *)0x0) {
        jsonAppendChar((JsonString *)(x_1.zSpace + 0x5e),'$');
      }
      else {
        zIn = cur[5].pVtab;
        sVar1 = strlen((char *)cur[5].pVtab);
        jsonAppendRaw((JsonString *)(x_1.zSpace + 0x5e),(char *)zIn,(u32)sVar1);
      }
      if (*(char *)&cur[3].pVtab == '\x06') {
        jsonPrintf(0x1e,(JsonString *)(x_1.zSpace + 0x5e),"[%d]",(ulong)*(uint *)&cur[1].pVtab);
      }
      else if (*(char *)&cur[3].pVtab == '\a') {
        jsonPrintf(pJStack_30->n,(JsonString *)(x_1.zSpace + 0x5e),".%.*s",
                   (ulong)(pJStack_30->n - 2),&((pJStack_30->u).pPatch)->jnFlags);
      }
    }
    else {
      jsonEachComputePath((JsonEachCursor *)cur,(JsonString *)(x_1.zSpace + 0x5e),
                          *(u32 *)&cur[2].pVtab);
    }
    jsonResult((JsonString *)(x_1.zSpace + 0x5e));
    break;
  case 7:
    if (*(char *)((long)&cur[3].pVtab + 1) != '\0') {
      jsonInit((JsonString *)&zRoot,ctx);
      jsonEachComputePath((JsonEachCursor *)cur,(JsonString *)&zRoot,
                          *(u32 *)((long)&(cur[9].pVtab)->pModule +
                                  (ulong)*(uint *)&cur[2].pVtab * 4));
      jsonResult((JsonString *)&zRoot);
      return 0;
    }
  default:
    local_150 = cur[5].pVtab;
    if (local_150 == (sqlite3_vtab *)0x0) {
      local_150 = (sqlite3_vtab *)0x23405f;
    }
    sqlite3_result_text(ctx,(char *)local_150,-1,(_func_void_void_ptr *)0x0);
    break;
  case 8:
    sqlite3_result_text(ctx,(char *)cur[8].pVtab,-1,(_func_void_void_ptr *)0x0);
  }
  return 0;
}

Assistant:

static int jsonEachColumn(
  sqlite3_vtab_cursor *cur,   /* The cursor */
  sqlite3_context *ctx,       /* First argument to sqlite3_result_...() */
  int i                       /* Which column to return */
){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  JsonNode *pThis = &p->sParse.aNode[p->i];
  switch( i ){
    case JEACH_KEY: {
      if( p->i==0 ) break;
      if( p->eType==JSON_OBJECT ){
        jsonReturn(pThis, ctx, 0);
      }else if( p->eType==JSON_ARRAY ){
        u32 iKey;
        if( p->bRecursive ){
          if( p->iRowid==0 ) break;
          iKey = p->sParse.aNode[p->sParse.aUp[p->i]].u.iKey;
        }else{
          iKey = p->iRowid;
        }
        sqlite3_result_int64(ctx, (sqlite3_int64)iKey);
      }
      break;
    }
    case JEACH_VALUE: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      jsonReturn(pThis, ctx, 0);
      break;
    }
    case JEACH_TYPE: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      sqlite3_result_text(ctx, jsonType[pThis->eType], -1, SQLITE_STATIC);
      break;
    }
    case JEACH_ATOM: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      if( pThis->eType>=JSON_ARRAY ) break;
      jsonReturn(pThis, ctx, 0);
      break;
    }
    case JEACH_ID: {
      sqlite3_result_int64(ctx, 
         (sqlite3_int64)p->i + ((pThis->jnFlags & JNODE_LABEL)!=0));
      break;
    }
    case JEACH_PARENT: {
      if( p->i>p->iBegin && p->bRecursive ){
        sqlite3_result_int64(ctx, (sqlite3_int64)p->sParse.aUp[p->i]);
      }
      break;
    }
    case JEACH_FULLKEY: {
      JsonString x;
      jsonInit(&x, ctx);
      if( p->bRecursive ){
        jsonEachComputePath(p, &x, p->i);
      }else{
        if( p->zRoot ){
          jsonAppendRaw(&x, p->zRoot, (int)strlen(p->zRoot));
        }else{
          jsonAppendChar(&x, '$');
        }
        if( p->eType==JSON_ARRAY ){
          jsonPrintf(30, &x, "[%d]", p->iRowid);
        }else if( p->eType==JSON_OBJECT ){
          jsonPrintf(pThis->n, &x, ".%.*s", pThis->n-2, pThis->u.zJContent+1);
        }
      }
      jsonResult(&x);
      break;
    }
    case JEACH_PATH: {
      if( p->bRecursive ){
        JsonString x;
        jsonInit(&x, ctx);
        jsonEachComputePath(p, &x, p->sParse.aUp[p->i]);
        jsonResult(&x);
        break;
      }
      /* For json_each() path and root are the same so fall through
      ** into the root case */
    }
    default: {
      const char *zRoot = p->zRoot;
      if( zRoot==0 ) zRoot = "$";
      sqlite3_result_text(ctx, zRoot, -1, SQLITE_STATIC);
      break;
    }
    case JEACH_JSON: {
      assert( i==JEACH_JSON );
      sqlite3_result_text(ctx, p->sParse.zJson, -1, SQLITE_STATIC);
      break;
    }
  }
  return SQLITE_OK;
}